

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O2

int Precond(sunrealtype tn,N_Vector y,N_Vector fy,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long *plVar8;
  undefined8 uVar9;
  double *pdVar10;
  double *pdVar11;
  double dVar12;
  double dVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  double dVar20;
  ulong uVar21;
  int local_c8;
  undefined4 local_b8;
  
  lVar17 = (long)user_data + 0x710;
  lVar14 = N_VGetArrayPointer(SUB84(tn,0));
  if (jok == 0) {
    pdVar18 = *user_data;
    dVar1 = *pdVar18;
    dVar2 = pdVar18[2];
    dVar3 = *(double *)((long)user_data + 0x1520);
    dVar4 = *(double *)((long)user_data + 0x1538);
    dVar5 = *(double *)((long)user_data + 0x1550);
    dVar6 = *(double *)((long)user_data + 0x1540);
    uVar21 = (ulong)DAT_00104090;
    dVar7 = pdVar18[1];
    pdVar18 = (double *)(lVar14 + 8);
    local_c8 = 1;
    for (lVar14 = 0; lVar14 != 0xf; lVar14 = lVar14 + 1) {
      dVar12 = ((double)(int)lVar14 + -0.5) * dVar4 + 30.0;
      dVar13 = exp(dVar12 * 0.2);
      dVar12 = exp((dVar4 + dVar12) * 0.2);
      dVar12 = dVar12 * dVar5 + dVar13 * dVar5 + dVar6 + dVar6;
      pdVar19 = pdVar18;
      for (lVar16 = -0x708; lVar16 != 0; lVar16 = lVar16 + 0x78) {
        plVar8 = *(long **)(lVar17 + 0x708 + lVar16);
        uVar9 = *(undefined8 *)(lVar17 + lVar16);
        dVar13 = *pdVar19 * (double)((ulong)dVar7 ^ uVar21);
        pdVar10 = (double *)*plVar8;
        dVar20 = pdVar19[-1] * (double)((ulong)dVar7 ^ uVar21);
        *pdVar10 = ((double)((ulong)dVar1 ^ uVar21) * dVar2 + dVar13) - dVar12;
        pdVar11 = (double *)plVar8[1];
        *pdVar11 = dVar20 + dVar3;
        pdVar10[1] = dVar1 * dVar2 + dVar13;
        pdVar11[1] = (dVar20 + (double)(uVar21 ^ (ulong)dVar3)) - dVar12;
        SUNDlsMat_denseCopy(plVar8,uVar9,2,2);
        pdVar19 = pdVar19 + 2;
      }
      lVar17 = lVar17 + 8;
      pdVar18 = pdVar18 + 0x1e;
    }
  }
  else {
    local_c8 = 0;
    for (lVar14 = 0; lVar14 != 0xf; lVar14 = lVar14 + 1) {
      for (lVar16 = -0x708; lVar16 != 0; lVar16 = lVar16 + 0x78) {
        SUNDlsMat_denseCopy(*(undefined8 *)(lVar17 + 0x708 + lVar16),
                            *(undefined8 *)(lVar17 + lVar16),2,2);
      }
      lVar17 = lVar17 + 8;
    }
  }
  lVar17 = (long)user_data + 8;
  *jcurPtr = local_c8;
  for (lVar14 = 0; lVar16 = 8, lVar14 != 0xf; lVar14 = lVar14 + 1) {
    for (; lVar16 != 0x710; lVar16 = lVar16 + 0x78) {
      local_b8 = SUB84(gamma,0);
      SUNDlsMat_denseScale(local_b8,*(undefined8 *)((long)user_data + lVar16),2,2);
    }
    user_data = (void *)((long)user_data + 8);
  }
  lVar14 = 0;
  do {
    if (lVar14 == 0xf) {
      return 0;
    }
    lVar16 = 0;
    while (lVar16 != 0xf) {
      SUNDlsMat_denseAddIdentity(*(undefined8 *)(lVar17 + lVar16 * 8),2);
      lVar15 = SUNDlsMat_denseGETRF
                         (*(undefined8 *)(lVar17 + lVar16 * 8),2,2,
                          *(undefined8 *)(lVar17 + 0xe10 + lVar16 * 8));
      lVar16 = lVar16 + 1;
      if (lVar15 != 0) {
        return 1;
      }
    }
    lVar14 = lVar14 + 1;
    lVar17 = lVar17 + 0x78;
  } while( true );
}

Assistant:

static int Precond(sunrealtype tn, N_Vector y, N_Vector fy, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype c1, c2, czdn, czup, diag, zdn, zup, q4coef, delz, verdco, hordco;
  sunrealtype**(*P)[MZ], **(*Jbd)[MZ];
  sunindextype retval;
  sunindextype*(*pivot)[MZ];
  int jx, jz;
  sunrealtype *ydata, **a, **j;
  UserData data;
  sunrealtype Q1, Q2, C3;

  /* Make local copies of pointers in user_data, and of pointer to y's data */
  data  = (UserData)user_data;
  P     = data->P;
  Jbd   = data->Jbd;
  pivot = data->pivot;
  ydata = N_VGetArrayPointer(y);

  /* Load problem coefficients and parameters */
  Q1 = data->p[0];
  Q2 = data->p[1];
  C3 = data->p[2];

  if (jok)
  {
    /* jok = SUNTRUE: Copy Jbd to P */

    for (jz = 0; jz < MZ; jz++)
    {
      for (jx = 0; jx < MX; jx++)
      {
        SUNDlsMat_denseCopy(Jbd[jx][jz], P[jx][jz], NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNFALSE;
  }

  else
  {
    /* jok = SUNFALSE: Generate Jbd from scratch and copy to P */

    /* Make local copies of problem variables, for efficiency. */

    q4coef = data->q4;
    delz   = data->dz;
    verdco = data->vdco;
    hordco = data->hdco;

    /* Compute 2x2 diagonal Jacobian blocks (using q4 values
     computed on the last f call).  Load into P. */

    for (jz = 0; jz < MZ; jz++)
    {
      zdn  = ZMIN + (jz - SUN_RCONST(0.5)) * delz;
      zup  = zdn + delz;
      czdn = verdco * exp(SUN_RCONST(0.2) * zdn);
      czup = verdco * exp(SUN_RCONST(0.2) * zup);
      diag = -(czdn + czup + SUN_RCONST(2.0) * hordco);
      for (jx = 0; jx < MX; jx++)
      {
        c1            = IJKth(ydata, 1, jx, jz);
        c2            = IJKth(ydata, 2, jx, jz);
        j             = Jbd[jx][jz];
        a             = P[jx][jz];
        IJth(j, 1, 1) = (-Q1 * C3 - Q2 * c2) + diag;
        IJth(j, 1, 2) = -Q2 * c1 + q4coef;
        IJth(j, 2, 1) = Q1 * C3 - Q2 * c2;
        IJth(j, 2, 2) = (-Q2 * c1 - q4coef) + diag;
        SUNDlsMat_denseCopy(j, a, NUM_SPECIES, NUM_SPECIES);
      }
    }

    *jcurPtr = SUNTRUE;
  }

  /* Scale by -gamma */

  for (jz = 0; jz < MZ; jz++)
  {
    for (jx = 0; jx < MX; jx++)
    {
      SUNDlsMat_denseScale(-gamma, P[jx][jz], NUM_SPECIES, NUM_SPECIES);
    }
  }

  /* Add identity matrix and do LU decompositions on blocks in place. */

  for (jx = 0; jx < MX; jx++)
  {
    for (jz = 0; jz < MZ; jz++)
    {
      SUNDlsMat_denseAddIdentity(P[jx][jz], NUM_SPECIES);
      retval = SUNDlsMat_denseGETRF(P[jx][jz], NUM_SPECIES, NUM_SPECIES,
                                    pivot[jx][jz]);
      if (retval != 0) { return (1); }
    }
  }

  return (0);
}